

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void scan_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = (tree->dl).dad;
  uVar3 = (uint)uVar1;
  uVar5 = 7;
  if (uVar1 == 0) {
    uVar5 = 0x8a;
  }
  iVar4 = (uVar1 != 0) + 3;
  tree[(long)max_code + 1].dl.dad = 0xffff;
  lVar6 = 0;
  uVar7 = 0xffffffff;
  do {
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      uVar2 = uVar3;
      if (max_code < lVar6) {
        return;
      }
      uVar1 = tree[lVar6 + 1].dl.dad;
      uVar3 = (uint)uVar1;
      lVar6 = lVar6 + 1;
      uVar9 = uVar8 + 1;
    } while (((int)uVar9 < (int)uVar5) && (uVar2 == uVar3));
    if ((int)uVar9 < iVar4) {
      s->bl_tree[uVar2].fc.freq = (short)uVar9 + s->bl_tree[uVar2].fc.freq;
    }
    else if (uVar2 == 0) {
      if (uVar8 < 10) {
        s->bl_tree[0x11].fc.freq = s->bl_tree[0x11].fc.freq + 1;
      }
      else {
        s->bl_tree[0x12].fc.freq = s->bl_tree[0x12].fc.freq + 1;
      }
    }
    else {
      if (uVar2 != uVar7) {
        s->bl_tree[uVar2].fc.freq = s->bl_tree[uVar2].fc.freq + 1;
      }
      s->bl_tree[0x10].fc.freq = s->bl_tree[0x10].fc.freq + 1;
    }
    iVar4 = 4 - (uint)(uVar2 == uVar3);
    uVar5 = uVar2 == uVar3 ^ 7;
    uVar7 = uVar2;
    if (uVar1 == 0) {
      uVar5 = 0x8a;
      iVar4 = 3;
    }
  } while( true );
}

Assistant:

local void scan_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree;   /* the tree to be scanned */
    int max_code;    /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    if (nextlen == 0) max_count = 138, min_count = 3;
    tree[max_code+1].Len = (ush)0xffff; /* guard */

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            s->bl_tree[curlen].Freq += count;
        } else if (curlen != 0) {
            if (curlen != prevlen) s->bl_tree[curlen].Freq++;
            s->bl_tree[REP_3_6].Freq++;
        } else if (count <= 10) {
            s->bl_tree[REPZ_3_10].Freq++;
        } else {
            s->bl_tree[REPZ_11_138].Freq++;
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}